

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

void __thiscall
glslang::HlslGrammar::acceptArraySpecifier(HlslGrammar *this,TArraySizes **arraySizes)

{
  HlslToken *pHVar1;
  bool bVar2;
  bool bVar3;
  TPoolAllocator *this_00;
  TArraySizes *pTVar4;
  TIntermTyped *sizeExpr;
  TArraySize arraySize;
  TSourceLoc loc;
  TIntermTyped *local_60;
  TArraySize local_58;
  TSourceLoc local_48;
  
  *arraySizes = (TArraySizes *)0x0;
  bVar2 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
  if (bVar2) {
    this_00 = GetThreadPoolAllocator();
    pTVar4 = (TArraySizes *)TPoolAllocator::allocate(this_00,0x18);
    (pTVar4->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00af64d8;
    (pTVar4->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar4->implicitArraySize = 0;
    pTVar4->implicitlySized = true;
    pTVar4->variablyIndexed = false;
    *arraySizes = pTVar4;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
    if (bVar2) {
      pHVar1 = &(this->super_HlslTokenStream).token;
      do {
        local_48.column = (this->super_HlslTokenStream).token.loc.column;
        local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        local_48.name = (pHVar1->loc).name;
        local_48.string = (this->super_HlslTokenStream).token.loc.string;
        local_48.line = (this->super_HlslTokenStream).token.loc.line;
        local_60 = (TIntermTyped *)0x0;
        bVar2 = acceptAssignmentExpression(this,&local_60);
        bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBracket);
        if (!bVar3) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,pHVar1,"Expected","]","");
          return;
        }
        if (bVar2) {
          HlslParseContext::arraySizeCheck(this->parseContext,&local_48,local_60,&local_58);
          pTVar4 = *arraySizes;
          TSmallArrayVector::push_back(&pTVar4->sizes,local_58.size,local_58.node);
          pTVar4->implicitlySized = false;
        }
        else {
          TSmallArrayVector::push_back(&(*arraySizes)->sizes,0,(TIntermTyped *)0x0);
        }
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void HlslGrammar::acceptArraySpecifier(TArraySizes*& arraySizes)
{
    arraySizes = nullptr;

    // Early-out if there aren't any array dimensions
    if (!peekTokenClass(EHTokLeftBracket))
        return;

    // If we get here, we have at least one array dimension.  This will track the sizes we find.
    arraySizes = new TArraySizes;

    // Collect each array dimension.
    while (acceptTokenClass(EHTokLeftBracket)) {
        TSourceLoc loc = token.loc;
        TIntermTyped* sizeExpr = nullptr;

        // Array sizing expression is optional.  If omitted, array will be later sized by initializer list.
        const bool hasArraySize = acceptAssignmentExpression(sizeExpr);

        if (! acceptTokenClass(EHTokRightBracket)) {
            expected("]");
            return;
        }

        if (hasArraySize) {
            TArraySize arraySize;
            parseContext.arraySizeCheck(loc, sizeExpr, arraySize);
            arraySizes->addInnerSize(arraySize);
        } else {
            arraySizes->addInnerSize(0);  // sized by initializers.
        }
    }
}